

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O3

axbStatus_t check_equal_csr(axbMat_s *A,axbMat_s *B,char *test_desc)

{
  axbStatus_t aVar1;
  void *row_markers;
  void *col_indices;
  void *values;
  void *row_markers_00;
  void *col_indices_00;
  void *values_00;
  size_t sVar2;
  char *__format;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  size_t A_nnz;
  size_t A_rows;
  size_t B_nnz;
  size_t B_rows;
  size_t B_cols;
  size_t A_cols;
  size_t local_68;
  size_t local_60;
  axbMat_s *local_58;
  size_t local_50;
  size_t local_48;
  size_t local_40;
  size_t local_38;
  
  aVar1 = axbMatGetSizes(A,&local_60,&local_38);
  if (aVar1 == 0) {
    aVar1 = axbMatGetNonzerosSize(A,&local_68);
    if (aVar1 == 0) {
      aVar1 = axbMatGetSizes(B,&local_48,&local_40);
      if (aVar1 == 0) {
        aVar1 = axbMatGetNonzerosSize(B,&local_50);
        if (aVar1 == 0) {
          local_58 = B;
          row_markers = malloc(local_60 * 4 + 4);
          sVar2 = local_68;
          col_indices = malloc(local_68 * 4);
          values = malloc(sVar2 << 3);
          aVar1 = axbMatGetValuesCSR(A,row_markers,AXB_INT_32,col_indices,AXB_INT_32,values,
                                     AXB_REAL_DOUBLE);
          if (aVar1 == 0) {
            row_markers_00 = malloc(local_48 * 4 + 4);
            col_indices_00 = malloc(local_50 * 4);
            values_00 = malloc(local_50 << 3);
            aVar1 = axbMatGetValuesCSR(local_58,row_markers_00,AXB_INT_32,col_indices_00,AXB_INT_32,
                                       values_00,AXB_REAL_DOUBLE);
            if (aVar1 == 0) {
              if (local_60 != 0) {
                sVar2 = 0;
                do {
                  dVar4 = (double)*(int *)((long)row_markers + sVar2 * 4);
                  dVar6 = (double)*(int *)((long)row_markers_00 + sVar2 * 4);
                  dVar3 = dVar4 - dVar6;
                  dVar5 = 1.0;
                  if (dVar3 != 0.0) {
                    dVar5 = ABS(dVar4);
                    dVar6 = ABS(dVar6);
                    if (dVar5 <= dVar6) {
                      dVar5 = dVar6;
                    }
                  }
                  if (1e-13 < dVar3 / dVar5) {
                    __format = 
                    "ERROR: Test %s (row array) failed with relative error %g: reference %d vs. libaxb %d\n Aborting...\n"
                    ;
                    goto LAB_001056f3;
                  }
                  sVar2 = sVar2 + 1;
                } while (local_60 != sVar2);
              }
              if (local_68 != 0) {
                sVar2 = 0;
                do {
                  dVar4 = (double)*(int *)((long)col_indices + sVar2 * 4);
                  dVar6 = (double)*(int *)((long)col_indices_00 + sVar2 * 4);
                  dVar3 = dVar4 - dVar6;
                  dVar5 = 1.0;
                  if (dVar3 != 0.0) {
                    dVar5 = ABS(dVar4);
                    dVar6 = ABS(dVar6);
                    if (dVar5 <= dVar6) {
                      dVar5 = dVar6;
                    }
                  }
                  if (1e-13 < dVar3 / dVar5) {
                    __format = 
                    "ERROR: Test %s (col array) failed with relative error %g: reference %d vs. libaxb %d\n Aborting...\n"
                    ;
LAB_001056f3:
                    fprintf(_stderr,__format,test_desc);
LAB_0010571e:
                    exit(1);
                  }
                  dVar5 = *(double *)((long)values + sVar2 * 8);
                  dVar3 = *(double *)((long)values_00 + sVar2 * 8);
                  dVar4 = dVar5 - dVar3;
                  if (dVar4 != 0.0) {
                    dVar5 = ABS(dVar5);
                    dVar3 = ABS(dVar3);
                    if (dVar5 <= dVar3) {
                      dVar5 = dVar3;
                    }
                    dVar4 = dVar4 / dVar5;
                  }
                  if (1e-13 < dVar4) {
                    fprintf(_stderr,
                            "ERROR: Test %s (col array) failed with relative error %g: reference %g vs. libaxb %g\n Aborting...\n"
                            ,test_desc);
                    goto LAB_0010571e;
                  }
                  sVar2 = sVar2 + 1;
                } while (local_68 != sVar2);
              }
              aVar1 = 0;
              printf("PASSED: Test %s\n",test_desc);
              free(row_markers);
              free(col_indices);
              free(values);
              free(row_markers_00);
              free(col_indices_00);
              free(values_00);
            }
            else {
              check_equal_csr_cold_6();
            }
          }
          else {
            check_equal_csr_cold_5();
          }
        }
        else {
          check_equal_csr_cold_4();
        }
      }
      else {
        check_equal_csr_cold_3();
      }
    }
    else {
      check_equal_csr_cold_2();
    }
  }
  else {
    check_equal_csr_cold_1();
  }
  return aVar1;
}

Assistant:

axbStatus_t check_equal_csr(const struct axbMat_s *A, const struct axbMat_s *B, const char *test_desc)
{
  //
  // Check 1: Dimensions
  //
  size_t A_rows, A_cols, A_nnz;
  AXB_ERR_CHECK(axbMatGetSizes(A, &A_rows, &A_cols));
  AXB_ERR_CHECK(axbMatGetNonzerosSize(A, &A_nnz));

  size_t B_rows, B_cols, B_nnz;
  AXB_ERR_CHECK(axbMatGetSizes(B, &B_rows, &B_cols));
  AXB_ERR_CHECK(axbMatGetNonzerosSize(B, &B_nnz));

  //
  // Check 2: Values
  //
  int *A_row_markers = malloc(sizeof(int)*(A_rows+1));
  int *A_col_indices = malloc(sizeof(int)*A_nnz);
  double *A_values   = malloc(sizeof(double)*A_nnz);
  AXB_ERR_CHECK(axbMatGetValuesCSR(A, A_row_markers, AXB_INT_32, A_col_indices, AXB_INT_32, A_values, AXB_REAL_DOUBLE));


  int *B_row_markers = malloc(sizeof(int)*(B_rows+1));
  int *B_col_indices = malloc(sizeof(int)*B_nnz);
  double *B_values   = malloc(sizeof(double)*B_nnz);
  AXB_ERR_CHECK(axbMatGetValuesCSR(B, B_row_markers, AXB_INT_32, B_col_indices, AXB_INT_32, B_values, AXB_REAL_DOUBLE));


  // test row array:
  for (size_t i=0; i<A_rows; ++i) {
    double rel_diff = get_rel_diff(A_row_markers[i], B_row_markers[i]);

    if (rel_diff > TEST_EPSILON) {
      fprintf(stderr, "ERROR: Test %s (row array) failed with relative error %g: reference %d vs. libaxb %d\n Aborting...\n", test_desc, rel_diff, A_row_markers[i], B_row_markers[i]);
      exit(EXIT_FAILURE);
    }
  }

  // test col indices and values arrays:
  for (size_t i=0; i<A_nnz; ++i) {
    double rel_diff = get_rel_diff(A_col_indices[i], B_col_indices[i]);

    if (rel_diff > TEST_EPSILON) {
      fprintf(stderr, "ERROR: Test %s (col array) failed with relative error %g: reference %d vs. libaxb %d\n Aborting...\n", test_desc, rel_diff, A_col_indices[i], B_col_indices[i]);
      exit(EXIT_FAILURE);
    }

    rel_diff = get_rel_diff(A_values[i], B_values[i]);

    if (rel_diff > TEST_EPSILON) {
      fprintf(stderr, "ERROR: Test %s (col array) failed with relative error %g: reference %g vs. libaxb %g\n Aborting...\n", test_desc, rel_diff, A_values[i], B_values[i]);
      exit(EXIT_FAILURE);
    }

  }


  printf("PASSED: Test %s\n", test_desc);

  free(A_row_markers);
  free(A_col_indices);
  free(A_values);
  free(B_row_markers);
  free(B_col_indices);
  free(B_values);
  return 0;
}